

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O0

void __thiscall agge::tests::DashTests::DashTests(DashTests *this)

{
  DashTests *this_local;
  
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__SegmentAreOutputtedAsIsIfDashIsLong_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__SegmentAreOutputtedAsIsIfDashIsLong_meta>
              *)this);
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__SegmentIsLimitedToADash_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__SegmentIsLimitedToADash_meta>
              *)&this->field_0x1);
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__ThePatternIsAppliedPeriodically_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__ThePatternIsAppliedPeriodically_meta>
              *)&this->field_0x2);
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__PointsWithinGapsAreNotEmitted_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__PointsWithinGapsAreNotEmitted_meta>
              *)&this->field_0x3);
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__EmittedSourcePointsCanBeFollowedWithGap_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__EmittedSourcePointsCanBeFollowedWithGap_meta>
              *)&this->field_0x4);
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__MultipleDashPatternIsSupported_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__MultipleDashPatternIsSupported_meta>
              *)&this->field_0x5);
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__ClosedPolygonProducesDashesForTheClosingSegment_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__ClosedPolygonProducesDashesForTheClosingSegment_meta>
              *)&this->field_0x6);
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__DashStartIsRespectedForASingleDashWhenGapIsHit_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__DashStartIsRespectedForASingleDashWhenGapIsHit_meta>
              *)&this->field_0x7);
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__DashStartIsRespectedForASingleDashWhenDashIsHit_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__DashStartIsRespectedForASingleDashWhenDashIsHit_meta>
              *)&this->field_0x8);
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__DashStartIsRespectedForAWholePeriod_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__DashStartIsRespectedForAWholePeriod_meta>
              *)&this->field_0x9);
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__DashStartIsRespectedForAMultiDashWhenDashIsHit_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__DashStartIsRespectedForAMultiDashWhenDashIsHit_meta>
              *)&this->field_0xa);
  ut::
  test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__NoEmptySegmentsAreAddedIfDashStartEqualsDashLength_meta>
  ::test_case_registrar
            ((test_case_registrar<agge::tests::DashTests,_&agge::tests::DashTests::__NoEmptySegmentsAreAddedIfDashStartEqualsDashLength_meta>
              *)&this->field_0xb);
  return;
}

Assistant:

test( SegmentAreOutputtedAsIsIfDashIsLong )
			{
				// INIT
				dash d;

				// INIT / ACT
				d.add_dash(6.0f, 1.0f);

				// ACT
				move_to(d, 1.1f, 17.0f);
				line_to(d, 4.1f, 13.0f);
				mocks::path::point result1[] = { vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference1[] = {
					{ 1.1f, 17.0f, path_command_move_to },
					{ 4.1f, 13.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, result1);

				// ACT
				d.remove_all();
				move_to(d, 1.0f, 1.0f);
				line_to(d, 2.5f, 3.0f);
				line_to(d, 2.7f, 3.1f);
				mocks::path::point result2[] = { vertex(d), vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference2[] = {
					{ 1.0f, 1.0f, path_command_move_to },
					{ 2.5f, 3.0f, path_command_line_to },
					{ 2.7f, 3.1f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, result2);
			}